

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

dynamic_string * __thiscall crnlib::dynamic_string::trim(dynamic_string *this)

{
  ushort uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  dynamic_string *pdVar5;
  uint uVar6;
  uint start;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  uVar1 = this->m_len;
  uVar9 = (ulong)uVar1;
  if (uVar1 == 0) {
    uVar8 = 0;
  }
  else {
    pcVar2 = this->m_pStr;
    uVar7 = 0;
    do {
      iVar3 = isspace((int)pcVar2[uVar7]);
      uVar8 = uVar7;
      if (iVar3 == 0) break;
      uVar7 = uVar7 + 1;
      uVar8 = uVar9;
    } while (uVar9 != uVar7);
  }
  pcVar2 = this->m_pStr;
  start = (uint)uVar8;
  uVar6 = uVar1 - 1;
  if ((int)start < (int)(uVar1 - 1)) {
    uVar6 = start;
  }
  iVar3 = uVar6 + 1;
  lVar10 = uVar9 - 1;
  do {
    if (lVar10 <= (int)start) goto LAB_00116ec3;
    iVar4 = isspace((int)pcVar2[lVar10]);
    lVar10 = lVar10 + -1;
  } while (iVar4 != 0);
  iVar3 = (int)lVar10 + 2;
LAB_00116ec3:
  pdVar5 = crop(this,start,iVar3 - start);
  return pdVar5;
}

Assistant:

dynamic_string& dynamic_string::trim()
    {
        int s, e;
        for (s = 0; s < (int)m_len; s++)
        {
            if (!isspace(m_pStr[s]))
            {
                break;
            }
        }

        for (e = m_len - 1; e > s; e--)
        {
            if (!isspace(m_pStr[e]))
            {
                break;
            }
        }

        return crop(s, e - s + 1);
    }